

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_range_exception(sexp ctx,sexp obj,sexp start,sexp end)

{
  sexp psVar1;
  sexp_sint_t n;
  sexp msg;
  sexp local_60;
  sexp_gc_var_t local_58;
  sexp local_48;
  sexp_gc_var_t local_40;
  
  local_58.var = &local_48;
  local_48 = (sexp)0x43e;
  local_40.var = &local_60;
  local_60 = (sexp)0x43e;
  local_40.next = &local_58;
  local_58.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  local_60 = sexp_c_string(ctx,"bad index range",-1);
  local_48 = sexp_list2(ctx,start,end);
  local_48 = sexp_cons_op(ctx,start,n,obj,local_48);
  psVar1 = sexp_intern(ctx,"range",-1);
  psVar1 = sexp_make_exception(ctx,psVar1,local_60,local_48,(sexp)&DAT_0000003e,(sexp)&DAT_0000003e)
  ;
  (ctx->value).context.saves = local_58.next;
  return psVar1;
}

Assistant:

sexp sexp_range_exception (sexp ctx, sexp obj, sexp start, sexp end) {
  sexp_gc_var2(res, msg);
  sexp_gc_preserve2(ctx, res, msg);
  msg = sexp_c_string(ctx, "bad index range", -1);
  res = sexp_list2(ctx, start, end);
  res = sexp_cons(ctx, obj, res);
  res = sexp_make_exception(ctx, sexp_intern(ctx, "range", -1), msg, res,
                            SEXP_FALSE, SEXP_FALSE);
  sexp_gc_release2(ctx);
  return res;
}